

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O2

bool __thiscall
ODDLParser::OpenDDLExport::writeValue(OpenDDLExport *this,Value *val,string *statement)

{
  byte bVar1;
  int8 iVar2;
  int16 iVar3;
  uint16 uVar4;
  uint32 uVar5;
  uint uVar6;
  char *pcVar7;
  int64 iVar8;
  uint64 uVar9;
  float fVar10;
  double dVar11;
  char buffer [256];
  stringstream stream;
  string asStack_2a8 [264];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (val == (Value *)0x0) goto switchD_005314c3_caseD_9;
  switch(val->m_type) {
  case ddl_bool:
    Value::getBool(val);
    std::__cxx11::string::append((char *)statement);
    goto switchD_005314c3_caseD_9;
  case ddl_int8:
    std::__cxx11::stringstream::stringstream(local_1a0);
    iVar2 = Value::getInt8(val);
    std::ostream::operator<<(local_190,(int)iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  case ddl_int16:
    std::__cxx11::stringstream::stringstream(local_1a0);
    memset(asStack_2a8,0,0x100);
    iVar3 = Value::getInt16(val);
    sprintf((char *)asStack_2a8,"%d",(ulong)(uint)(int)iVar3);
    std::__cxx11::string::append((char *)statement);
    goto LAB_005317fd;
  case ddl_int32:
    std::__cxx11::stringstream::stringstream(local_1a0);
    memset(asStack_2a8,0,0x100);
    uVar6 = Value::getInt32(val);
    sprintf((char *)asStack_2a8,"%d",(ulong)uVar6);
    std::__cxx11::string::append((char *)statement);
    goto LAB_005317fd;
  case ddl_int64:
    std::__cxx11::stringstream::stringstream(local_1a0);
    iVar8 = Value::getInt64(val);
    std::ostream::operator<<(local_190,(int)iVar8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  case ddl_unsigned_int8:
    std::__cxx11::stringstream::stringstream(local_1a0);
    bVar1 = Value::getUnsignedInt8(val);
    std::ostream::operator<<(local_190,(uint)bVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  case ddl_unsigned_int16:
    std::__cxx11::stringstream::stringstream(local_1a0);
    uVar4 = Value::getUnsignedInt16(val);
    std::ostream::operator<<(local_190,(uint)uVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  case ddl_unsigned_int32:
    std::__cxx11::stringstream::stringstream(local_1a0);
    uVar5 = Value::getUnsignedInt32(val);
    std::ostream::operator<<(local_190,uVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  case ddl_unsigned_int64:
    std::__cxx11::stringstream::stringstream(local_1a0);
    uVar9 = Value::getUnsignedInt64(val);
    std::ostream::operator<<(local_190,(int)uVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  default:
    goto switchD_005314c3_caseD_9;
  case ddl_float:
    std::__cxx11::stringstream::stringstream(local_1a0);
    fVar10 = Value::getFloat(val);
    std::ostream::operator<<(local_190,fVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  case ddl_double:
    std::__cxx11::stringstream::stringstream(local_1a0);
    dVar11 = Value::getDouble(val);
    std::ostream::_M_insert<double>(dVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    break;
  case ddl_string:
    std::__cxx11::stringstream::stringstream(local_1a0);
    pcVar7 = Value::getString(val);
    std::operator<<(local_190,pcVar7);
    std::__cxx11::string::append((char *)statement);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)statement);
    std::__cxx11::string::~string(asStack_2a8);
    std::__cxx11::string::append((char *)statement);
    goto LAB_005317fd;
  }
  std::__cxx11::string::~string(asStack_2a8);
LAB_005317fd:
  std::__cxx11::stringstream::~stringstream(local_1a0);
switchD_005314c3_caseD_9:
  return val != (Value *)0x0;
}

Assistant:

bool OpenDDLExport::writeValue( Value *val, std::string &statement ) {
    if (ddl_nullptr == val) {
        return false;
    }

    switch ( val->m_type ) {
        case Value::ddl_bool:
            if ( true == val->getBool() ) {
                statement += "true";
            } else {
                statement += "false";
            }
            break;
        case Value::ddl_int8: 
            {
                std::stringstream stream;
                const int i = static_cast<int>( val->getInt8() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_int16:
            {
                std::stringstream stream;
                char buffer[ 256 ];
                ::memset( buffer, '\0', 256 * sizeof( char ) );
                sprintf( buffer, "%d", val->getInt16() );
                statement += buffer;
        }
            break;
        case Value::ddl_int32:
            {
                std::stringstream stream;
                char buffer[ 256 ];
                ::memset( buffer, '\0', 256 * sizeof( char ) );
                const int i = static_cast< int >( val->getInt32() );
                sprintf( buffer, "%d", i );
                statement += buffer;
            }
            break;
        case Value::ddl_int64:
            {
                std::stringstream stream;
                const int i = static_cast< int >( val->getInt64() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int8:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt8() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int16:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt16() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int32:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt32() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int64:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt64() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_half:
            break;
        case Value::ddl_float:
            {
                std::stringstream stream;
                stream << val->getFloat();
                statement += stream.str();
            }
            break;
        case Value::ddl_double:
            {
                std::stringstream stream;
                stream << val->getDouble();
                statement += stream.str();
            }
            break;
        case Value::ddl_string:
            {
                std::stringstream stream;
                stream << val->getString();
                statement += "\"";
                statement += stream.str();
                statement += "\"";
             }
            break;
        case Value::ddl_ref:
            break;
        case Value::ddl_none:
        case Value::ddl_types_max:
        default:
            break;
    }

    return true;
}